

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

TheoryTerm * __thiscall Potassco::TheoryData::getTerm(TheoryData *this,Id_t id)

{
  bool bVar1;
  TheoryTerm *pTVar2;
  uint in_ESI;
  undefined8 in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = hasTerm((TheoryData *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (Id_t)((ulong)in_RDI >> 0x20));
  if (!bVar1) {
    fail(-2,"const TheoryTerm &Potassco::TheoryData::getTerm(Id_t) const",0x145,"hasTerm(id)",
         "Unknown term \'%u\'",(ulong)in_ESI,0);
  }
  pTVar2 = terms((TheoryData *)0x142a52);
  return pTVar2 + in_ESI;
}

Assistant:

const TheoryTerm& TheoryData::getTerm(Id_t id) const {
	POTASSCO_REQUIRE(hasTerm(id), "Unknown term '%u'", unsigned(id));
	return terms()[id];
}